

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  int iVar6;
  FILE *pFVar7;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  int extraout_EDX;
  undefined8 uVar8;
  __sigset_t *unaff_R15;
  sigaction sa;
  allocator local_1f1;
  gulcalcopts local_1f0;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  sigaction local_c8;
  
  local_1f0.rndopt = usehashedseed;
  local_1f0.rand_vector_size = 1000000;
  local_1f0.rand_seed = 0;
  local_1f0.item_output._M_dataplus._M_p = (pointer)&local_1f0.item_output.field_2;
  local_1f0.item_output._M_string_length = 0;
  local_1f0.item_output.field_2._M_local_buf[0] = '\0';
  local_1f0.coverage_output._M_dataplus._M_p = (pointer)&local_1f0.coverage_output.field_2;
  local_1f0.coverage_output._M_string_length = 0;
  local_1f0.coverage_output.field_2._M_local_buf[0] = '\0';
  local_1f0.correlated_output._M_dataplus._M_p = (pointer)&local_1f0.correlated_output.field_2;
  local_1f0.correlated_output._M_string_length = 0;
  local_1f0.correlated_output.field_2._M_local_buf[0] = '\0';
  local_1f0.itemLevelOutput = false;
  local_1f0.coverageLevelOutput = false;
  local_1f0.correlatedLevelOutput = false;
  local_1f0.samplesize = -1;
  local_1f0.debug = false;
  local_1f0.itemout = (FILE *)_stdout;
  local_1f0.covout = (FILE *)_stdout;
  local_1f0.corrout = (FILE *)_stdout;
  local_1f0.allocRule = -1;
  local_1f0.benchmark = false;
  local_1f0.loss_threshold = 1e-06;
  progname = *argv;
  while( true ) {
    while( true ) {
      while (iVar6 = getopt(argc,argv,"Alvhdrba:L:S:c:i:j:R:s:"),
            sVar5 = local_1f0.correlated_output._M_string_length,
            sVar4 = local_1f0.coverage_output._M_string_length,
            sVar3 = local_1f0.item_output._M_string_length, pcVar2 = _optarg, 0x51 < iVar6) {
        switch(iVar6) {
        case 0x61:
          local_1f0.allocRule = atoi(_optarg);
          break;
        case 0x62:
          local_1f0.benchmark = true;
          break;
        case 99:
          strlen(_optarg);
          std::__cxx11::string::_M_replace
                    ((ulong)&local_1f0.coverage_output,0,(char *)sVar4,(ulong)pcVar2);
          local_1f0.coverageLevelOutput = true;
          unaff_R15 = (__sigset_t *)sVar4;
          break;
        case 100:
          local_1f0.debug = true;
          break;
        case 0x65:
        case 0x66:
        case 0x67:
        case 0x68:
        case 0x6b:
        case 0x6d:
        case 0x6e:
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x74:
        case 0x75:
          goto switchD_001077db_caseD_65;
        case 0x69:
          strlen(_optarg);
          std::__cxx11::string::_M_replace
                    ((ulong)&local_1f0.item_output,0,(char *)sVar3,(ulong)pcVar2);
          local_1f0.itemLevelOutput = true;
          unaff_R15 = (__sigset_t *)sVar3;
          break;
        case 0x6a:
          strlen(_optarg);
          std::__cxx11::string::_M_replace
                    ((ulong)&local_1f0.correlated_output,0,(char *)sVar5,(ulong)pcVar2);
          local_1f0.correlatedLevelOutput = true;
          unaff_R15 = (__sigset_t *)sVar5;
          break;
        case 0x6c:
          local_1f0.rndopt = usecachedvector;
          break;
        case 0x72:
          local_1f0.rndopt = userandomnumberfile;
          break;
        case 0x73:
          local_1f0.rand_seed = atoi(_optarg);
          break;
        case 0x76:
          goto switchD_001077db_caseD_76;
        default:
          if (iVar6 == 0x52) {
            local_1f0.rand_vector_size = atoi(_optarg);
          }
          else {
            if (iVar6 != 0x53) goto switchD_001077db_caseD_65;
            local_1f0.samplesize = atoi(_optarg);
          }
        }
      }
      if (iVar6 != 0x41) break;
      local_1f0.rndopt = usehashedseed;
    }
    if (iVar6 != 0x4c) break;
    local_1f0.loss_threshold = atof(_optarg);
  }
  if (iVar6 != -1) {
switchD_001077db_caseD_65:
    main_cold_6();
    goto switchD_001077db_caseD_76;
  }
  memset(&local_c8,0,0x98);
  unaff_R15 = &local_c8.sa_mask;
  sigemptyset(unaff_R15);
  local_c8.__sigaction_handler.sa_handler = segfault_sigaction;
  local_c8.sa_flags = 4;
  sigaction(0xb,&local_c8,(sigaction *)0x0);
  pFVar7 = (FILE *)local_1f0.itemout;
  if ((local_1f0.itemLevelOutput == true) &&
     (iVar6 = std::__cxx11::string::compare((char *)&local_1f0.item_output), pFVar7 = _stdout,
     iVar6 != 0)) {
    pFVar7 = fopen(local_1f0.item_output._M_dataplus._M_p,"wb");
  }
  local_1f0.itemout = (FILE *)pFVar7;
  pFVar7 = (FILE *)local_1f0.covout;
  if (local_1f0.coverageLevelOutput == true) {
    if (local_1f0.allocRule < 1) {
      iVar6 = std::__cxx11::string::compare((char *)&local_1f0.coverage_output);
      pFVar7 = _stdout;
      if (iVar6 != 0) {
        pFVar7 = fopen(local_1f0.coverage_output._M_dataplus._M_p,"wb");
      }
    }
    else {
      fprintf(_stderr,
              "WARNING: Alloc rule %d and coverage output are incompatible - ignoring coverage output\n"
             );
      local_1f0.coverageLevelOutput = false;
      pFVar7 = (FILE *)local_1f0.covout;
    }
  }
  local_1f0.covout = (FILE *)pFVar7;
  if ((local_1f0.correlatedLevelOutput == true) &&
     (local_1f0.corrout = (FILE *)fopen(local_1f0.correlated_output._M_dataplus._M_p,"wb"),
     (FILE *)local_1f0.corrout == (FILE *)0x0)) goto LAB_00107c74;
  if (local_1f0.coverageLevelOutput == false && local_1f0.itemLevelOutput == false)
  goto LAB_00107c67;
  if (local_1f0.allocRule < 4) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    initstreams(&local_e8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)&local_128,progname,&local_1f1);
    paVar1 = &local_148.field_2;
    local_148._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"INFO","");
    logprintf(&local_128,&local_148,"starting process..\n");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    doit(&local_1f0);
    std::__cxx11::string::string((string *)&local_128,progname,&local_1f1);
    local_148._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"INFO","");
    logprintf(&local_128,&local_148,"finishing process..\n");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.correlated_output._M_dataplus._M_p != &local_1f0.correlated_output.field_2) {
      operator_delete(local_1f0.correlated_output._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.coverage_output._M_dataplus._M_p != &local_1f0.coverage_output.field_2) {
      operator_delete(local_1f0.coverage_output._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.item_output._M_dataplus._M_p != &local_1f0.item_output.field_2) {
      operator_delete(local_1f0.item_output._M_dataplus._M_p);
    }
    return 0;
  }
LAB_00107c6f:
  main_cold_3();
LAB_00107c74:
  main_cold_5();
  if ((__sigset_t *)local_148._M_dataplus._M_p != unaff_R15) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if ((uint *)local_128._M_dataplus._M_p != &switchD_001077db::switchdataD_0010a280) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  uVar8 = extraout_RAX;
  if (extraout_EDX == 1) {
    main_cold_2();
    uVar8 = extraout_RAX_00;
  }
  gulcalcopts::~gulcalcopts(&local_1f0);
  _Unwind_Resume(uVar8);
switchD_001077db_caseD_76:
  main_cold_1();
LAB_00107c67:
  main_cold_4();
  goto LAB_00107c6f;
}

Assistant:

int main(int argc, char *argv[])
{
	int opt;
	gulcalcopts gopt;
	gopt.loss_threshold = 0.000001;
	progname = argv[0];
	while ((opt = getopt(argc, argv, "Alvhdrba:L:S:c:i:j:R:s:")) != -1) {
		switch (opt) {
		case 'S':
			gopt.samplesize = atoi(optarg);
			break;
		case 'l':
			gopt.rndopt = rd_option::usecachedvector;
			break;
		case 'A':
			gopt.rndopt = rd_option::usehashedseed;
			break;
		case 'a':
			gopt.allocRule = atoi(optarg);
			break;
		case 'b':
			gopt.benchmark = true;
			break;
		case 'r':
			gopt.rndopt = rd_option::userandomnumberfile;
			break;
		case 'L':
			gopt.loss_threshold = atof(optarg);
			break;
		case 'R':
			gopt.rand_vector_size = atoi(optarg);
			break;
		case 'i':
			gopt.item_output = optarg;
			gopt.itemLevelOutput = true;
			break;
		case 'j':
			gopt.correlated_output = optarg;
			gopt.correlatedLevelOutput = true;
			break;
		case 'c':
			gopt.coverage_output = optarg;
			gopt.coverageLevelOutput = true;
			break;
		case 'd':
			gopt.debug = true;
			break;		
		case 's':
			gopt.rand_seed = atoi(optarg);
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
		default: /* '?' */
			help();
			exit(EXIT_FAILURE);
		}
	}

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	if (gopt.itemLevelOutput == true) {
		if (gopt.item_output == "-") gopt.itemout = stdout;
		else gopt.itemout = fopen(gopt.item_output.c_str(), "wb");
	}
	if (gopt.coverageLevelOutput == true) {
		if (gopt.allocRule <= 0) {
			if (gopt.coverage_output == "-") gopt.covout = stdout;
			else gopt.covout = fopen(gopt.coverage_output.c_str(), "wb");
		} else {
			fprintf(stderr, "WARNING: Alloc rule %d and coverage output are incompatible - ignoring coverage output\n", gopt.allocRule);
			gopt.coverageLevelOutput = false;
		}
	}
	if(gopt.correlatedLevelOutput == true) {
		gopt.corrout = fopen(gopt.correlated_output.c_str(), "wb");
		if(gopt.corrout == NULL) {
			fprintf(stderr, "FATAL: Correlated output file name must be specified\n");
			exit(EXIT_FAILURE);
		}
	}

	if (gopt.itemLevelOutput == false && gopt.coverageLevelOutput == false) {
		fprintf(stderr, "FATAL: S%s: No output option selected\n", argv[0]);
		exit(EXIT_FAILURE);
	}

	if (gopt.allocRule > 3) {
		fprintf(stderr, "FATAL: Invalid alloc rule %d\n", gopt.allocRule);
		exit(EXIT_FAILURE);
	}

	try {
		initstreams();
		logprintf(progname, "INFO", "starting process..\n");
		doit(gopt);
		logprintf(progname, "INFO", "finishing process..\n");
	}catch (std::bad_alloc&) {
			fprintf(stderr, "FATAL:%s: Memory allocation failed\n", progname);
			exit(EXIT_FAILURE);
	}

}